

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

void Abc_CutFactor_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vLeaves)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *vLeaves_local;
  Abc_Obj_t *pObj_local;
  
  if ((*(uint *)&pObj->field_0x14 >> 4 & 1) == 0) {
    iVar1 = Abc_ObjIsCi(pObj);
    if ((iVar1 == 0) &&
       ((iVar1 = Abc_ObjFanoutNum(pObj), iVar1 < 2 ||
        (iVar1 = Abc_NodeIsMuxControlType(pObj), iVar1 != 0)))) {
      pAVar2 = Abc_ObjFanin0(pObj);
      Abc_CutFactor_rec(pAVar2,vLeaves);
      pAVar2 = Abc_ObjFanin1(pObj);
      Abc_CutFactor_rec(pAVar2,vLeaves);
    }
    else {
      Vec_PtrPush(vLeaves,pObj);
      *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffef | 0x10;
    }
  }
  return;
}

Assistant:

void Abc_CutFactor_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vLeaves )
{
    if ( pObj->fMarkA )
        return;
    if ( Abc_ObjIsCi(pObj) || (Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsMuxControlType(pObj)) )
    {
        Vec_PtrPush( vLeaves, pObj );
        pObj->fMarkA = 1;
        return;
    }
    Abc_CutFactor_rec( Abc_ObjFanin0(pObj), vLeaves );
    Abc_CutFactor_rec( Abc_ObjFanin1(pObj), vLeaves );
}